

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

StringStream<4096UL,_4096UL> * __thiscall
spirv_cross::StringStream<4096UL,_4096UL>::operator<<(StringStream<4096UL,_4096UL> *this,uint32_t v)

{
  string s;
  string local_30;
  
  ::std::__cxx11::to_string(&local_30,v);
  append(this,local_30._M_dataplus._M_p,local_30._M_string_length);
  ::std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

StringStream &operator<<(uint32_t v)
	{
		auto s = std::to_string(v);
		append(s.data(), s.size());
		return *this;
	}